

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int __status;
  ostream *poVar1;
  Application app;
  Application local_48;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"This is a simple command line Force Feedback testing demo ...");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "All connected joystick devices will be created and if FF Support is found,"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "you\'ll be able to play some predefined variable effects on them.");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "Note: 1 effect can be played on 1 joystick at a time for the moment.");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_48._nStatus = 0;
  local_48._pInputMgr = (InputManager *)0x0;
  local_48._pEventHdlr = (EventHandler *)0x0;
  local_48._pKeyboard = (Keyboard *)0x0;
  local_48._pJoystickMgr = (JoystickManager *)0x0;
  local_48._pEffectMgr = (EffectManager *)0x0;
  local_48._pXDisp._0_2_ = 0;
  local_48._pXDisp._2_6_ = 0;
  local_48._xWin._0_2_ = 0;
  local_48._50_8_ = 0;
  __status = Application::initialize(&local_48);
  if (__status == 0) {
    Application::printHelp(&local_48);
    __status = Application::run(&local_48);
  }
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Exiting ...");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(__status);
}

Assistant:

int main(int argc, const char* argv[])
{

	cout << endl
		 << "This is a simple command line Force Feedback testing demo ..." << endl
		 << "All connected joystick devices will be created and if FF Support is found," << endl
		 << "you'll be able to play some predefined variable effects on them." << endl
		 << endl
		 << "Note: 1 effect can be played on 1 joystick at a time for the moment." << endl
		 << endl;

	Application app(argc, argv);

	int status = app.initialize();

	if(!status)
	{
		app.printHelp();

		status = app.run();
	}

	cout << endl
		 << endl
		 << "Exiting ..." << endl
		 << endl;

#if defined OIS_WIN32_PLATFORM && _DEBUG
	cout << "Click on this window and ..." << endl;
	system("pause");
#endif

	exit(status);
}